

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

xml_node * xml_parse_node(xml_parser *parser)

{
  uint8_t *puVar1;
  size_t sVar2;
  xml_parser *pxVar3;
  xml_parser *pxVar4;
  uint8_t uVar5;
  int iVar6;
  xml_string *__ptr;
  xml_attribute **__ptr_00;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  char *__s;
  char *__s_00;
  undefined8 *puVar10;
  undefined8 *puVar11;
  ushort **ppuVar12;
  xml_string *__ptr_01;
  xml_string *__ptr_02;
  xml_node *pxVar13;
  ulong uVar14;
  ulong uVar15;
  char **nextp;
  char **nextp_00;
  char **nextp_01;
  size_t sVar16;
  xml_parser_offset offset;
  size_t sVar17;
  xml_node **ppxVar18;
  char *rest;
  xml_node **local_68;
  int local_58;
  undefined8 local_50;
  size_t local_48;
  xml_parser *local_40;
  uint8_t *local_38;
  
  local_68 = (xml_node **)calloc(1,8);
  *local_68 = (xml_node *)0x0;
  xml_skip_whitespace(parser);
  uVar5 = xml_parser_peek(parser,0);
  if (uVar5 == '<') {
    uVar14 = parser->position + 1;
    parser->position = uVar14;
    if (parser->length <= uVar14) {
      parser->position = parser->length - 1;
    }
    __ptr = xml_parse_tag_end(parser);
  }
  else {
    __ptr = (xml_string *)0x0;
    xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_tag_open::expected opening tag");
  }
  if (__ptr == (xml_string *)0x0) {
    xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag_open");
    __ptr_01 = (xml_string *)0x0;
  }
  else {
    sVar9 = __ptr->length;
    local_50 = 0;
    __ptr_00 = (xml_attribute **)calloc(1,8);
    *__ptr_00 = (xml_attribute *)0x0;
    pcVar7 = (char *)calloc(sVar9 + 1,1);
    memcpy(pcVar7,__ptr->buffer,sVar9);
    pcVar7[sVar9] = '\0';
    local_48 = sVar9;
    pcVar8 = xml_strtok_r(pcVar7,(char *)&local_50,nextp);
    pxVar3 = local_40;
    if (pcVar8 != (char *)0x0) {
      sVar9 = strlen(pcVar8);
      __ptr->length = sVar9;
      pcVar8 = xml_strtok_r((char *)0x0,(char *)&local_50,nextp_00);
      pxVar4 = parser;
      pxVar3 = local_40;
      while (local_40 = pxVar4, pcVar8 != (char *)0x0) {
        sVar9 = strlen(pcVar8);
        __s = (char *)malloc(sVar9 + 1);
        __s_00 = (char *)malloc(sVar9 + 1);
        iVar6 = __isoc99_sscanf(pcVar8,"%[^=]=\"%[^\"]",__s,__s_00);
        if ((iVar6 == 2) ||
           (iVar6 = __isoc99_sscanf(pcVar8,"%[^=]=\'%[^\']",__s,__s_00), iVar6 == 2)) {
          local_58 = (int)pcVar7;
          puVar1 = __ptr->buffer;
          sVar9 = strlen(__s);
          local_38 = puVar1 + ((int)pcVar8 - local_58) + sVar9 + 2;
          puVar10 = (undefined8 *)malloc(0x10);
          puVar11 = (undefined8 *)malloc(0x10);
          *puVar10 = puVar11;
          *puVar11 = puVar1 + ((int)pcVar8 - local_58);
          puVar11[1] = sVar9;
          puVar11 = (undefined8 *)malloc(0x10);
          puVar10[1] = puVar11;
          *puVar11 = local_38;
          sVar9 = strlen(__s_00);
          puVar11[1] = sVar9;
          sVar9 = 8;
          do {
            sVar16 = sVar9;
            sVar9 = sVar16 + 8;
          } while (*(long *)((long)__ptr_00 + (sVar16 - 8)) != 0);
          __ptr_00 = (xml_attribute **)realloc(__ptr_00,sVar16 + 8);
          *(undefined8 **)((long)__ptr_00 + (sVar16 - 8)) = puVar10;
          *(undefined8 *)((long)__ptr_00 + sVar16) = 0;
          parser = local_40;
        }
        free(__s);
        free(__s_00);
        pcVar8 = xml_strtok_r((char *)0x0,(char *)&local_50,nextp_01);
        pxVar4 = local_40;
        pxVar3 = local_40;
      }
    }
    local_40 = pxVar3;
    free(pcVar7);
    if ((__ptr->length != 0) && (__ptr->buffer[local_48 - 1] == '/')) {
      __ptr_01 = (xml_string *)0x0;
      goto LAB_001031f3;
    }
    uVar5 = xml_parser_peek(parser,0);
    if (uVar5 == '<') {
      __ptr_01 = (xml_string *)0x0;
      do {
        uVar5 = xml_parser_peek(parser,1);
        if (uVar5 == '/') goto LAB_00103133;
        pxVar13 = xml_parse_node(parser);
        if (pxVar13 == (xml_node *)0x0) {
          xml_parser_error(parser,NEXT_CHARACTER,"xml_parse_node::child");
        }
        else {
          sVar9 = 8;
          do {
            sVar16 = sVar9;
            sVar9 = sVar16 + 8;
          } while (*(long *)((long)local_68 + (sVar16 - 8)) != 0);
          local_68 = (xml_node **)realloc(local_68,sVar16 + 8);
          *(xml_node **)((long)local_68 + (sVar16 - 8)) = pxVar13;
          *(undefined8 *)((long)local_68 + sVar16) = 0;
        }
      } while (pxVar13 != (xml_node *)0x0);
      goto LAB_00103250;
    }
    xml_skip_whitespace(parser);
    sVar2 = parser->position;
    uVar14 = parser->length;
    sVar17 = 0;
    do {
      if (uVar14 <= sVar17 + sVar2) break;
      uVar5 = xml_parser_peek(parser,0);
      if (uVar5 != '<') {
        uVar15 = parser->position + 1;
        if (uVar14 <= uVar15) {
          uVar15 = uVar14 - 1;
        }
        parser->position = uVar15;
        sVar17 = sVar17 + 1;
      }
    } while (uVar5 != '<');
    uVar5 = xml_parser_peek(parser,0);
    if (uVar5 == '<') {
      if (sVar17 != 0) {
        ppuVar12 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar12 + (ulong)parser->buffer[sVar17 + (sVar2 - 1)] * 2 + 1) &
              0x20) == 0) goto LAB_00103113;
          sVar17 = sVar17 - 1;
        } while (sVar17 != 0);
        sVar17 = 0;
      }
LAB_00103113:
      __ptr_01 = (xml_string *)malloc(0x10);
      __ptr_01->buffer = parser->buffer + sVar2;
      __ptr_01->length = sVar17;
    }
    else {
      __ptr_01 = (xml_string *)0x0;
      xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_content::expected <");
    }
    if (__ptr_01 == (xml_string *)0x0) {
      pcVar7 = "xml_parse_node::content";
      __ptr_01 = (xml_string *)0x0;
      offset = CURRENT_CHARACTER;
    }
    else {
LAB_00103133:
      xml_skip_whitespace(parser);
      uVar5 = xml_parser_peek(parser,0);
      if (uVar5 == '<') {
        uVar5 = xml_parser_peek(parser,1);
        if (uVar5 != '/') goto LAB_00103194;
        uVar14 = parser->position + 2;
        parser->position = uVar14;
        if (parser->length <= uVar14) {
          parser->position = parser->length - 1;
        }
        __ptr_02 = xml_parse_tag_end(parser);
      }
      else {
        xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_tag_close::expected closing tag `<\'");
LAB_00103194:
        uVar5 = xml_parser_peek(parser,1);
        if (uVar5 != '/') {
          xml_parser_error(parser,NEXT_CHARACTER,"xml_parse_tag_close::expected closing tag `/\'");
        }
        __ptr_02 = (xml_string *)0x0;
      }
      if (__ptr_02 != (xml_string *)0x0) {
        sVar2 = __ptr->length;
        if (sVar2 == __ptr_02->length) {
          if (sVar2 != 0) {
            sVar17 = 0;
            do {
              if (__ptr->buffer[sVar17] != __ptr_02->buffer[sVar17]) goto LAB_00103215;
              sVar17 = sVar17 + 1;
            } while (sVar2 != sVar17);
          }
          free(__ptr_02);
LAB_001031f3:
          pxVar13 = (xml_node *)malloc(0x20);
          pxVar13->name = __ptr;
          pxVar13->content = __ptr_01;
          pxVar13->attributes = __ptr_00;
          pxVar13->children = local_68;
          return pxVar13;
        }
LAB_00103215:
        xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag missmatch");
        goto LAB_00103253;
      }
      pcVar7 = "xml_parse_node::tag_close";
      offset = NO_CHARACTER;
    }
    xml_parser_error(parser,offset,pcVar7);
  }
LAB_00103250:
  __ptr_02 = (xml_string *)0x0;
LAB_00103253:
  if (__ptr != (xml_string *)0x0) {
    free(__ptr);
  }
  if (__ptr_02 != (xml_string *)0x0) {
    free(__ptr_02);
  }
  if (__ptr_01 != (xml_string *)0x0) {
    free(__ptr_01);
  }
  pxVar13 = *local_68;
  ppxVar18 = local_68;
  while (pxVar13 != (xml_node *)0x0) {
    ppxVar18 = ppxVar18 + 1;
    xml_node_free(pxVar13);
    pxVar13 = *ppxVar18;
  }
  free(local_68);
  return (xml_node *)0x0;
}

Assistant:

static struct xml_node* xml_parse_node(struct xml_parser* parser) {
	xml_parser_info(parser, "node");

	/* Setup variables
	 */
	struct xml_string* tag_open = 0;
	struct xml_string* tag_close = 0;
	struct xml_string* content = 0;

	size_t original_length;
	struct xml_attribute** attributes;

	struct xml_node** children = calloc(1, sizeof(struct xml_node*));
	children[0] = 0;


	/* Parse open tag
	 */
	tag_open = xml_parse_tag_open(parser);
	if (!tag_open) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag_open");
		goto exit_failure;
	}

	original_length = tag_open->length;
	attributes = xml_find_attributes(parser, tag_open);

	/* If tag ends with `/' it's self closing, skip content lookup */
	if (tag_open->length > 0 && '/' == tag_open->buffer[original_length - 1]) {
		/* Drop `/'
		 */
		goto node_creation;
	}

	/* If the content does not start with '<', a text content is assumed
	 */
	if ('<' != xml_parser_peek(parser, CURRENT_CHARACTER)) {
		content = xml_parse_content(parser);

		if (!content) {
			xml_parser_error(parser, 0, "xml_parse_node::content");
			goto exit_failure;
		}


	/* Otherwise children are to be expected
	 */
	} else while ('/' != xml_parser_peek(parser, NEXT_CHARACTER)) {

		/* Parse child node
		 */
		struct xml_node* child = xml_parse_node(parser);
		if (!child) {
			xml_parser_error(parser, NEXT_CHARACTER, "xml_parse_node::child");
			goto exit_failure;
		}

		/* Grow child array :)
		 */
		size_t old_elements = get_zero_terminated_array_nodes(children);
		size_t new_elements = old_elements + 1;
		children = realloc(children, (new_elements + 1) * sizeof(struct xml_node*));

		/* Save child
		 */
		children[new_elements - 1] = child;
		children[new_elements] = 0;
	}


	/* Parse close tag
	 */
	tag_close = xml_parse_tag_close(parser);
	if (!tag_close) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag_close");
		goto exit_failure;
	}


	/* Close tag has to match open tag
	 */
	if (!xml_string_equals(tag_open, tag_close)) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag missmatch");
		goto exit_failure;
	}


	/* Return parsed node
	 */
	xml_string_free(tag_close);

node_creation:;
	struct xml_node* node = malloc(sizeof(struct xml_node));
	node->name = tag_open;
	node->content = content;
	node->attributes = attributes;
	node->children = children;
	return node;


	/* A failure occured, so free all allocalted resources
	 */
exit_failure:
	if (tag_open) {
		xml_string_free(tag_open);
	}
	if (tag_close) {
		xml_string_free(tag_close);
	}
	if (content) {
		xml_string_free(content);
	}

	struct xml_node** it = children;
	while (*it) {
		xml_node_free(*it);
		++it;
	}
	free(children);

	return 0;
}